

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall
GEO::AdaptiveKdTree::plane_split
          (AdaptiveKdTree *this,index_t b_in,index_t e_in,coord_index_t coord,double val,
          index_t *br1_out,index_t *br2_out)

{
  pointer puVar1;
  uint uVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  index_t iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  index_t iVar8;
  ulong uVar9;
  ulong uVar10;
  index_t iVar11;
  pointer puVar12;
  uint uVar13;
  pointer puVar14;
  double *pdVar15;
  
  uVar2 = e_in - 1;
  uVar3 = CONCAT71(in_register_00000009,coord) & 0xffffffff;
  puVar1 = (this->super_KdTree).point_index_.
           super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar12 = puVar1;
  uVar13 = uVar2;
  while( true ) {
    pdVar15 = (this->super_KdTree).super_NearestNeighborSearch.points_;
    iVar4 = (this->super_KdTree).super_NearestNeighborSearch.stride_;
    iVar8 = e_in;
    if ((int)e_in < (int)b_in) {
      iVar8 = b_in;
    }
    while ((iVar11 = iVar8, iVar8 != b_in &&
           (iVar11 = b_in,
           pdVar15[uVar3 + puVar12[b_in] * iVar4] <= val &&
           val != pdVar15[uVar3 + puVar12[b_in] * iVar4]))) {
      b_in = b_in + 1;
    }
    uVar6 = 0xffffffff;
    if ((int)uVar13 < -1) {
      uVar6 = uVar13;
    }
    while ((uVar7 = uVar6, -1 < (int)uVar13 &&
           (uVar7 = uVar13, val <= pdVar15[uVar3 + puVar12[uVar13] * iVar4]))) {
      uVar13 = uVar13 - 1;
    }
    puVar14 = puVar12;
    uVar13 = iVar11;
    if ((int)uVar7 < (int)iVar11) break;
    uVar13 = puVar1[iVar11];
    puVar1[iVar11] = puVar1[uVar7];
    puVar1[uVar7] = uVar13;
    b_in = iVar11 + 1;
    uVar13 = uVar7 - 1;
    puVar12 = (this->super_KdTree).point_index_.
              super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
              super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  while( true ) {
    uVar5 = (ulong)uVar13;
    uVar9 = (ulong)e_in;
    if ((int)e_in < (int)uVar13) {
      uVar9 = uVar5;
    }
    while ((uVar10 = uVar9, (int)uVar9 != (int)uVar5 &&
           (uVar10 = uVar5, pdVar15[uVar3 + puVar14[uVar5] * iVar4] <= val))) {
      uVar5 = (ulong)((int)uVar5 + 1);
    }
    while (((int)iVar11 <= (int)uVar2 && (val < pdVar15[uVar3 + puVar14[uVar2] * iVar4]))) {
      uVar2 = uVar2 - 1;
    }
    iVar8 = (index_t)uVar10;
    if ((int)uVar2 < (int)iVar8) break;
    uVar13 = puVar12[uVar10];
    puVar12[uVar10] = puVar12[uVar2];
    puVar12[uVar2] = uVar13;
    uVar2 = uVar2 - 1;
    pdVar15 = (this->super_KdTree).super_NearestNeighborSearch.points_;
    iVar4 = (this->super_KdTree).super_NearestNeighborSearch.stride_;
    puVar14 = (this->super_KdTree).point_index_.
              super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
              super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar13 = iVar8 + 1;
  }
  *br1_out = iVar11;
  *br2_out = iVar8;
  return;
}

Assistant:

void AdaptiveKdTree::plane_split(
	index_t b_in, index_t e_in, coord_index_t coord, double val,
	index_t& br1_out, index_t& br2_out
    ) {
	int b = int(b_in);
	int e = int(e_in);
	int l=b;
	int r=e-1;
	while(true) {
	    while(l < e && point_coord(l,coord) < val) {
		++l;
	    }
	    while(r >= 0 && point_coord(r,coord) >= val) {
		--r;
	    }
	    if(l > r) {
		break;
	    }
	    std::swap(point_index_[l], point_index_[r]);
	    ++l; --r;
	}
	int br1 = l;
	r = e-1;
	while(true) {
	    while(l < e && point_coord(l,coord) <= val) {
		++l;
	    }
	    while(r >= br1 && point_coord(r,coord) > val) {
		--r;
	    }
	    if(l > r) {
		break;
	    }
	    std::swap(point_index_[l], point_index_[r]);
	    ++l; --r;
	}
	int br2 = l;
	br1_out = index_t(br1);
	br2_out = index_t(br2);
    }